

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  ImDrawListSplitter *pIVar8;
  ImGuiTableColumn *pIVar9;
  ImDrawCmd *pIVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  bool bVar13;
  undefined1 auVar14 [60];
  ImGuiContext *pIVar15;
  ImDrawChannel *pIVar16;
  int merge_group_n;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  MergeGroup *merge_group;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  ImDrawChannel *pIVar27;
  ImU32 mask;
  int iVar28;
  bool bVar29;
  undefined1 auVar31 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar32 [32];
  undefined1 auVar37 [64];
  undefined1 auVar39 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar43;
  ImBitArray<132> remaining_mask;
  MergeGroup merge_groups [4];
  undefined1 local_108 [32];
  ulong local_e8;
  ulong local_e0;
  undefined1 local_d8 [4];
  float fStack_d4;
  undefined8 uStack_d0;
  int iStack_c8;
  uint auStack_c4 [11];
  undefined1 auStack_98 [32];
  undefined1 local_78 [32];
  undefined1 auStack_58 [32];
  undefined1 auVar30 [16];
  undefined1 auVar35 [64];
  undefined1 auVar38 [64];
  undefined1 auVar40 [64];
  undefined1 auVar36 [64];
  
  pIVar15 = GImGui;
  pIVar8 = table->DrawSplitter;
  cVar5 = table->FreezeRowsCount;
  cVar6 = table->FreezeColumnsCount;
  auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
  auStack_58 = (undefined1  [32])0x0;
  auStack_98 = ZEXT1632(ZEXT816(0) << 0x40);
  local_78 = (undefined1  [32])0x0;
  _local_d8 = auVar42;
  local_e0 = (ulong)table->ColumnsCount;
  if (0 < (long)local_e0) {
    local_e8 = table->VisibleMaskByIndex;
    uVar18 = 0;
    uVar20 = 0;
    do {
      if ((local_e8 >> (uVar18 & 0x3f) & 1) != 0) {
        pIVar9 = (table->Columns).Data;
        pIVar27 = (pIVar8->_Channels).Data;
        iVar26 = 0;
        do {
          bVar7 = *(byte *)((long)pIVar9 + (0x59 - (ulong)(iVar26 == 0)) + uVar18 * 0x68);
          pIVar16 = pIVar27 + bVar7;
          iVar19 = pIVar27[bVar7]._CmdBuffer.Size;
          if ((0 < (long)iVar19) && ((pIVar16->_CmdBuffer).Data[(long)iVar19 + -1].ElemCount == 0))
          {
            (pIVar16->_CmdBuffer).Size = iVar19 + -1;
          }
          if ((pIVar16->_CmdBuffer).Size == 1) {
            if ((pIVar9[uVar18].Flags & 0x100) == 0) {
              if (cVar5 < '\x01') {
                fVar43 = pIVar9[uVar18].ContentMaxXUnfrozen;
LAB_002e46c9:
                fVar2 = pIVar9[uVar18].ContentMaxXHeadersUsed;
                uVar12 = vcmpss_avx512f(ZEXT416((uint)fVar2),ZEXT416((uint)fVar43),2);
                bVar29 = (bool)((byte)uVar12 & 1);
                auVar33._16_48_ = auVar42._16_48_;
                auVar33._0_16_ = ZEXT416((uint)fVar2);
                auVar42._4_60_ = auVar33._4_60_;
                auVar42._0_4_ = (float)((uint)bVar29 * (int)fVar43 + (uint)!bVar29 * (int)fVar2);
                fVar43 = auVar42._0_4_;
              }
              else {
                if (iVar26 == 0) {
                  fVar43 = pIVar9[uVar18].ContentMaxXFrozen;
                  goto LAB_002e46c9;
                }
                fVar43 = pIVar9[uVar18].ContentMaxXUnfrozen;
              }
              if (pIVar9[uVar18].ClipRect.Max.x < fVar43) goto LAB_002e477b;
            }
            uVar25 = (uint)(iVar26 != 0) * 2;
            if (cVar5 < '\x01') {
              uVar25 = 2;
            }
            uVar23 = (uint)((long)cVar6 <= (long)uVar18 || cVar6 < '\x01');
            lVar17 = (ulong)(uVar25 | uVar23) * 0x28;
            pfVar1 = (float *)(local_d8 + lVar17);
            iVar19 = *(int *)(local_d8 + lVar17 + 0x10);
            if (iVar19 == 0) {
              pfVar1[0] = 3.4028235e+38;
              pfVar1[1] = 3.4028235e+38;
              *(undefined8 *)(local_d8 + lVar17 + 8) = 0xff7fffffff7fffff;
            }
            *(uint *)(local_d8 + (ulong)(bVar7 >> 5) * 4 + lVar17 + 0x14) =
                 *(uint *)(local_d8 + (ulong)(bVar7 >> 5) * 4 + lVar17 + 0x14) | 1 << (bVar7 & 0x1f)
            ;
            *(int *)(local_d8 + lVar17 + 0x10) = iVar19 + 1;
            pIVar10 = (pIVar16->_CmdBuffer).Data;
            fVar43 = (pIVar10->ClipRect).x;
            if (fVar43 < *pfVar1) {
              *pfVar1 = fVar43;
            }
            fVar43 = (pIVar10->ClipRect).y;
            if (fVar43 < *(float *)(local_d8 + lVar17 + 4)) {
              *(float *)(local_d8 + lVar17 + 4) = fVar43;
            }
            fVar43 = (pIVar10->ClipRect).z;
            if (*(float *)(local_d8 + lVar17 + 8) < fVar43) {
              *(float *)(local_d8 + lVar17 + 8) = fVar43;
            }
            fVar43 = (pIVar10->ClipRect).w;
            if (*(float *)(local_d8 + lVar17 + 0xc) < fVar43) {
              *(float *)(local_d8 + lVar17 + 0xc) = fVar43;
            }
            uVar20 = uVar20 | 1 << (uVar25 | uVar23);
          }
LAB_002e477b:
          bVar29 = iVar26 == 0;
          iVar26 = iVar26 + -1;
        } while (('\0' < cVar5) && (bVar29));
        pIVar9[uVar18].DrawChannelCurrent = 0xff;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != local_e0);
    if (uVar20 != 0) {
      iVar19 = pIVar8->_Count + -2;
      iVar26 = (pIVar15->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar26 < iVar19) {
        if (iVar26 == 0) {
          iVar28 = 8;
        }
        else {
          iVar28 = iVar26 / 2 + iVar26;
        }
        if (iVar28 <= iVar19) {
          iVar28 = iVar19;
        }
        if (iVar26 < iVar28) {
          local_108._20_12_ = local_108._28_12_;
          pIVar16 = (ImDrawChannel *)MemAlloc((long)iVar28 << 5);
          pIVar27 = (pIVar15->DrawChannelsTempMergeBuffer).Data;
          if (pIVar27 != (ImDrawChannel *)0x0) {
            memcpy(pIVar16,pIVar27,(long)(pIVar15->DrawChannelsTempMergeBuffer).Size << 5);
            MemFree((pIVar15->DrawChannelsTempMergeBuffer).Data);
          }
          (pIVar15->DrawChannelsTempMergeBuffer).Data = pIVar16;
          (pIVar15->DrawChannelsTempMergeBuffer).Capacity = iVar28;
        }
      }
      (pIVar15->DrawChannelsTempMergeBuffer).Size = iVar19;
      pIVar27 = (pIVar15->DrawChannelsTempMergeBuffer).Data;
      local_108._0_16_ = ZEXT816(0);
      local_108._16_4_ = 0;
      ImBitArray<132>::SetBitRange((ImBitArray<132> *)local_108,2,pIVar8->_Count);
      bVar7 = table->Bg2DrawChannelUnfrozen & 0x1f;
      *(uint *)(local_108 + (ulong)(table->Bg2DrawChannelUnfrozen >> 5) * 4) =
           *(uint *)(local_108 + (ulong)(table->Bg2DrawChannelUnfrozen >> 5) * 4) &
           (-2 << bVar7 | 0xfffffffeU >> 0x20 - bVar7);
      iVar26 = (pIVar8->_Count - (uint)('\0' < cVar5)) + -2;
      fVar43 = (table->HostClipRect).Min.x;
      fVar2 = (table->HostClipRect).Min.y;
      fVar3 = (table->HostClipRect).Max.x;
      fVar4 = (table->HostClipRect).Max.y;
      uVar18 = 0;
      do {
        iVar19 = *(int *)(local_d8 + uVar18 * 0x28 + 0x10);
        if (iVar19 != 0) {
          lVar17 = uVar18 * 0x28;
          uVar20 = *(uint *)(local_d8 + lVar17 + 0xc);
          auVar30 = ZEXT416(uVar20);
          bVar29 = 1 < uVar18;
          if ((bVar29) && ((table->Flags & 0x20000) == 0)) {
            uVar12 = vcmpss_avx512f(ZEXT416((uint)fVar4),ZEXT416(uVar20),2);
            bVar13 = (bool)((byte)uVar12 & 1);
            auVar35._16_48_ = auVar42._16_48_;
            auVar35._0_16_ = ZEXT416((uint)fVar4);
            auVar34._4_60_ = auVar35._4_60_;
            auVar34._0_4_ = bVar13 * uVar20 + (uint)!bVar13 * (int)fVar4;
            auVar30 = auVar34._0_16_;
          }
          auVar36._32_32_ = auVar42._32_32_;
          uVar20 = *(uint *)(local_d8 + lVar17 + 8);
          auVar31 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_d8 + lVar17 + 0x14));
          auVar32 = vmovdqu32_avx512vl(local_108);
          auVar36._0_32_ = ZEXT2032(auVar32._0_20_);
          auVar31 = vpandn_avx2(ZEXT2032(auVar31._0_20_),auVar36._0_32_);
          auVar14._4_56_ = auVar36._8_56_;
          auVar14._0_4_ = auVar32._4_4_;
          auVar42._0_32_ =
               ZEXT2032(CONCAT416(auVar32._16_4_,
                                  CONCAT412(auVar32._12_4_,
                                            CONCAT48(auVar32._8_4_,auVar14._0_8_ << 0x20))));
          auVar42._32_32_ = auVar36._32_32_;
          local_108 = vmovdqu32_avx512vl(auVar31);
          iVar26 = iVar26 - iVar19;
          if (0 < pIVar8->_Count) {
            auVar11 = vminss_avx(ZEXT416(*(uint *)(local_d8 + lVar17)),ZEXT416((uint)fVar43));
            auVar38._16_48_ = auVar42._16_48_;
            bVar7 = (byte)uVar18;
            auVar38._0_16_ = auVar11;
            auVar37._4_60_ = auVar38._4_60_;
            auVar37._0_4_ =
                 (uint)(bVar7 & 1) *
                 ((uint)(cVar6 < '\x01') * auVar11._0_4_ +
                 (uint)('\0' < cVar6) * *(uint *)(local_d8 + lVar17)) +
                 (uint)!(bool)(bVar7 & 1) * auVar11._0_4_;
            auVar11 = vminss_avx(ZEXT416(*(uint *)(local_d8 + lVar17 + 4)),ZEXT416((uint)fVar2));
            auVar40._16_48_ = auVar38._16_48_;
            auVar40._0_16_ = auVar11;
            auVar39._4_60_ = auVar40._4_60_;
            auVar39._0_4_ =
                 (uint)bVar29 *
                 ((uint)('\0' < cVar5) * *(uint *)(local_d8 + lVar17 + 4) +
                 (uint)('\0' >= cVar5) * auVar11._0_4_) + (uint)!bVar29 * auVar11._0_4_;
            uVar12 = vcmpss_avx512f(ZEXT416((uint)fVar3),ZEXT416(uVar20),2);
            bVar29 = (bool)((byte)uVar12 & 1);
            auVar41._16_48_ = auVar38._16_48_;
            auVar41._0_16_ = ZEXT416(uVar20);
            auVar42._4_60_ = auVar41._4_60_;
            auVar42._0_4_ =
                 (float)((uint)(bVar7 & 1) * (bVar29 * uVar20 + (uint)!bVar29 * (int)fVar3) +
                        !(bool)(bVar7 & 1) * uVar20);
            auVar11 = vinsertps_avx(auVar37._0_16_,auVar39._0_16_,0x10);
            auVar30 = vinsertps_avx(auVar42._0_16_,auVar30,0x10);
            auVar30 = vmovlhps_avx(auVar11,auVar30);
            lVar21 = 8;
            uVar22 = 0;
            do {
              uVar24 = uVar22 >> 5 & 0x7ffffff;
              if ((*(uint *)(local_d8 + uVar24 * 4 + lVar17 + 0x14) >> ((uint)uVar22 & 0x1f) & 1) !=
                  0) {
                *(uint *)(local_d8 + uVar24 * 4 + lVar17 + 0x14) =
                     ~(1 << ((uint)uVar22 & 0x1f)) &
                     *(uint *)(local_d8 + uVar24 * 4 + lVar17 + 0x14);
                iVar19 = iVar19 + -1;
                pIVar16 = (pIVar8->_Channels).Data;
                **(undefined1 (**) [16])((long)&(pIVar16->_CmdBuffer).Size + lVar21) = auVar30;
                *pIVar27 = *(ImDrawChannel *)((long)pIVar16 + lVar21 + -8);
                pIVar27 = pIVar27 + 1;
              }
              uVar22 = uVar22 + 1;
            } while (((long)uVar22 < (long)pIVar8->_Count) && (lVar21 = lVar21 + 0x20, iVar19 != 0))
            ;
          }
        }
        if (uVar18 == 1 && '\0' < cVar5) {
          *pIVar27 = (pIVar8->_Channels).Data[table->Bg2DrawChannelUnfrozen];
          pIVar27 = pIVar27 + 1;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 4);
      iVar19 = pIVar8->_Count;
      if ((0 < iVar19) && (iVar26 != 0)) {
        lVar17 = 0;
        uVar18 = 0;
        do {
          if ((*(uint *)(local_108 + (uVar18 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar18 & 0x1f) & 1) !=
              0) {
            *pIVar27 = *(ImDrawChannel *)
                        ((long)&(((pIVar8->_Channels).Data)->_CmdBuffer).Size + lVar17);
            pIVar27 = pIVar27 + 1;
            iVar26 = iVar26 + -1;
          }
          uVar18 = uVar18 + 1;
          iVar19 = pIVar8->_Count;
        } while (((long)uVar18 < (long)iVar19) && (lVar17 = lVar17 + 0x20, iVar26 != 0));
      }
      memcpy((pIVar8->_Channels).Data + 2,(pIVar15->DrawChannelsTempMergeBuffer).Data,
             (long)iVar19 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}